

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::tokenize_text
          (Tokenizer *this,string *text,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *alphabets)

{
  CaseType letter_case;
  ulong uVar1;
  bool bVar2;
  Casing CVar3;
  size_type sVar4;
  size_t sVar5;
  Token *pTVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  long in_RCX;
  long in_RDI;
  int in_stack_0000006c;
  code_point_t in_stack_00000070;
  bool segment_number;
  bool segment_alphabet_change;
  bool segment_alphabet;
  bool segment_case;
  Casing new_casing;
  char *alphabet_name;
  int alphabet;
  bool is_number;
  bool is_letter;
  bool has_combining_marks;
  value_type *next_c;
  size_t next_index;
  code_point_t v;
  value_type *c_1;
  size_t i;
  int prev_alphabet;
  State state;
  TokensBuilder builder;
  int script;
  CharInfo *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *__range2;
  int previous_script;
  vector<int,_std::allocator<int>_> scripts;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> chars;
  Token *in_stack_fffffffffffffd18;
  TokensBuilder *in_stack_fffffffffffffd20;
  Options *in_stack_fffffffffffffd28;
  TokensBuilder *in_stack_fffffffffffffd30;
  Token *in_stack_fffffffffffffd38;
  TokensBuilder *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  Token *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  Casing in_stack_fffffffffffffd5c;
  TokensBuilder *in_stack_fffffffffffffd60;
  Token *in_stack_fffffffffffffd78;
  TokensBuilder *in_stack_fffffffffffffd80;
  bool local_26b;
  byte local_26a;
  bool local_25f;
  const_reference local_1d0;
  _Node_iterator_base<int,_false> local_188;
  _Node_iterator_base<int,_false> local_180;
  byte local_173;
  bool local_172;
  byte local_171;
  Casing local_170;
  allocator<char> local_169;
  string local_168 [32];
  char *local_148;
  int local_140;
  byte local_13b;
  byte local_13a;
  byte local_139;
  const_reference local_138;
  size_type local_130;
  int local_124;
  const_reference local_120;
  ulong local_118;
  int local_110;
  int local_10c;
  TokensBuilder local_108;
  int local_84;
  reference local_80;
  CharInfo *local_78;
  __normal_iterator<const_onmt::unicode::CharInfo_*,_std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>_>
  local_70;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *local_68;
  int local_60;
  vector<int,_std::allocator<int>_> local_50;
  vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> local_38;
  long local_20;
  
  local_20 = in_RCX;
  unicode::get_characters_info
            ((string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3c4e29);
  std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::size(&local_38);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
             CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  local_60 = -1;
  local_68 = &local_38;
  local_70._M_current =
       (CharInfo *)
       std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::begin
                 ((vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *)
                  in_stack_fffffffffffffd18);
  local_78 = (CharInfo *)
             std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::end
                       ((vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *
                        )in_stack_fffffffffffffd18);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_onmt::unicode::CharInfo_*,_std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>_>
                             *)in_stack_fffffffffffffd20,
                            (__normal_iterator<const_onmt::unicode::CharInfo_*,_std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>_>
                             *)in_stack_fffffffffffffd18), bVar2) {
    local_80 = __gnu_cxx::
               __normal_iterator<const_onmt::unicode::CharInfo_*,_std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>_>
               ::operator*(&local_70);
    local_84 = unicode::get_script(in_stack_00000070,in_stack_0000006c);
    std::vector<int,std::allocator<int>>::emplace_back<int_const&>
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30,
               (int *)in_stack_fffffffffffffd28);
    if (local_84 != -1) {
      local_60 = local_84;
    }
    __gnu_cxx::
    __normal_iterator<const_onmt::unicode::CharInfo_*,_std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>_>
    ::operator++(&local_70);
  }
  TokensBuilder::TokensBuilder
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (vector<onmt::Token,_std::allocator<onmt::Token>_> *)in_stack_fffffffffffffd20);
  local_10c = 2;
  local_110 = -1;
  for (local_118 = 0; uVar1 = local_118,
      sVar4 = std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::size
                        (&local_38), uVar1 < sVar4; local_118 = local_118 + 1) {
    local_120 = std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::
                operator[](&local_38,local_118);
    local_124 = local_120->value;
    if ((0x1f < local_124) && (local_124 != 0xfeff)) {
      sVar5 = get_next_main_char((vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                                  *)in_stack_fffffffffffffd40,
                                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd38,
                                 (size_t)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      local_130 = sVar5;
      sVar4 = std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::size
                        (&local_38);
      if (sVar5 < sVar4) {
        local_1d0 = std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::
                    operator[](&local_38,local_130);
      }
      else {
        local_1d0 = (const_reference)0x0;
      }
      local_138 = local_1d0;
      local_139 = local_130 != local_118 + 1;
      if (local_10c == 4) {
        if (local_124 == 0xff60) {
          TokensBuilder::append(in_stack_fffffffffffffd20,(CharInfo *)in_stack_fffffffffffffd18);
          if ((*(byte *)(in_RDI + 0x5a) & 1) != 0) {
            pTVar6 = TokensBuilder::current(&local_108);
            pTVar6->preserve = true;
          }
          local_110 = -2;
          local_10c = 0;
        }
        else if (local_120->char_type == Separator) {
          TokensBuilder::escape_append
                    (in_stack_fffffffffffffd80,(CharInfo *)in_stack_fffffffffffffd78);
        }
        else {
          TokensBuilder::append(in_stack_fffffffffffffd20,(CharInfo *)in_stack_fffffffffffffd18);
        }
      }
      else if (local_124 == 0xff5f) {
        if (local_10c != 2) {
          TokensBuilder::segment(in_stack_fffffffffffffd60);
          if (((local_10c == 0) && (local_110 != -2)) || (local_10c == 1)) {
            pTVar6 = TokensBuilder::current(&local_108);
            pTVar6->join_left = true;
          }
          else {
            pTVar6 = TokensBuilder::previous((TokensBuilder *)0x3c5232);
            pTVar6->join_right = true;
          }
        }
        TokensBuilder::append(in_stack_fffffffffffffd20,(CharInfo *)in_stack_fffffffffffffd18);
        local_10c = 4;
      }
      else if (local_120->char_type == Separator) {
        if ((bool)local_139) {
          if (local_10c != 2) {
            TokensBuilder::segment(in_stack_fffffffffffffd60);
            pTVar6 = TokensBuilder::current(&local_108);
            pTVar6->join_left = true;
          }
          TokensBuilder::escape_append
                    (in_stack_fffffffffffffd80,(CharInfo *)in_stack_fffffffffffffd78);
          TokensBuilder::append
                    (in_stack_fffffffffffffd40,
                     (vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *)
                     in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30,
                     (size_t)in_stack_fffffffffffffd28);
          TokensBuilder::segment(in_stack_fffffffffffffd60);
          local_118 = local_130 - 1;
          local_10c = 3;
        }
        else {
          if (local_10c != 2) {
            TokensBuilder::segment(in_stack_fffffffffffffd60);
          }
          if (((*(byte *)(in_RDI + 0x34) & 1) != 0) &&
             ((TokensBuilder::append
                         (in_stack_fffffffffffffd20,(CharInfo *)in_stack_fffffffffffffd18),
              local_138 == (const_reference)0x0 || (local_138->char_type != Separator)))) {
            TokensBuilder::segment(in_stack_fffffffffffffd60);
          }
          local_10c = 2;
        }
      }
      else if (((*(byte *)(in_RDI + 0x5c) & 1) == 0) ||
              (bVar2 = unicode::CharInfo::operator==
                                 ((CharInfo *)in_stack_fffffffffffffd30,
                                  (string *)in_stack_fffffffffffffd28), !bVar2)) {
        local_13a = local_120->char_type == Letter;
        local_13b = local_120->char_type == Number;
        local_140 = -1;
        if ((bool)local_13b) {
          local_140 = -3;
        }
        else if ((bool)local_13a) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,local_118);
          local_140 = *pvVar7;
        }
        if (local_20 != 0) {
          local_148 = "Other";
          if ((local_13b & 1) == 0) {
            if (((local_13a & 1) != 0) && (-1 < local_140)) {
              local_148 = unicode::get_script_name((int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            }
          }
          else {
            local_148 = "Numeric";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd60,
                     (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     (allocator<char> *)in_stack_fffffffffffffd50);
          pmVar8 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                 *)in_stack_fffffffffffffd20,&in_stack_fffffffffffffd18->surface);
          *pmVar8 = *pmVar8 + 1;
          std::__cxx11::string::~string(local_168);
          std::allocator<char>::~allocator(&local_169);
        }
        if ((*(int *)(in_RDI + 8) == 0) &&
           (((((local_13b & 1) != 0 || (bVar2 = unicode::CharInfo::operator==(local_120,'_'), bVar2)
              ) || ((local_10c == 0 && (bVar2 = unicode::CharInfo::operator==(local_120,'-'), bVar2)
                    ))) ||
            ((local_10c == 0 &&
             ((((bVar2 = unicode::CharInfo::operator==(local_120,'.'), bVar2 ||
                (bVar2 = unicode::CharInfo::operator==(local_120,','), bVar2)) &&
               (local_138 != (const_reference)0x0)) &&
              ((local_138->char_type == Number || (local_138->char_type == Letter)))))))))) {
          local_13a = 1;
          local_140 = -3;
        }
        if (((local_13a & 1) == 0) || (*(int *)(in_RDI + 8) == 2)) {
          if (((local_13b & 1) == 0) || (*(int *)(in_RDI + 8) == 2)) {
            if (local_10c != 2) {
              TokensBuilder::segment(in_stack_fffffffffffffd60);
              in_stack_fffffffffffffd20 = (TokensBuilder *)TokensBuilder::current(&local_108);
              *(undefined1 *)((long)&in_stack_fffffffffffffd20->_current_token + 0x18) = 1;
              if (((*(byte *)(in_RDI + 0x5b) & 1) != 0) && (local_120->char_type == Mark)) {
                in_stack_fffffffffffffd18 = TokensBuilder::current(&local_108);
                in_stack_fffffffffffffd18->preserve = true;
              }
            }
            TokensBuilder::safe_append
                      (in_stack_fffffffffffffd40,(CharInfo *)in_stack_fffffffffffffd38);
            if ((local_139 & 1) != 0) {
              TokensBuilder::append
                        (in_stack_fffffffffffffd40,
                         (vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                          *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30,
                         (size_t)in_stack_fffffffffffffd28);
              local_118 = local_130 - 1;
            }
            TokensBuilder::segment(in_stack_fffffffffffffd60);
            local_10c = 3;
          }
          else {
            bVar2 = (*(byte *)(in_RDI + 0x5e) & 1) != 0;
            if ((local_10c == 0) || (bVar2 && local_10c == 1)) {
              if (((*(byte *)(in_RDI + 0x5b) & 1) != 0) && (bVar2 && local_10c == 1)) {
                in_stack_fffffffffffffd40 = (TokensBuilder *)TokensBuilder::current(&local_108);
                *(undefined1 *)((long)&in_stack_fffffffffffffd40->_current_token + 0x1b) = 1;
              }
              TokensBuilder::segment(in_stack_fffffffffffffd60);
              if ((local_10c == 0) && (local_110 != -2)) {
                in_stack_fffffffffffffd30 = (TokensBuilder *)TokensBuilder::current(&local_108);
                *(undefined1 *)((long)&in_stack_fffffffffffffd30->_current_token + 0x18) = 1;
              }
              else {
                in_stack_fffffffffffffd38 = TokensBuilder::previous((TokensBuilder *)0x3c5c71);
                in_stack_fffffffffffffd38->join_right = true;
              }
            }
            else if (local_10c == 3) {
              in_stack_fffffffffffffd28 =
                   (Options *)TokensBuilder::previous((TokensBuilder *)0x3c5cb9);
              in_stack_fffffffffffffd28->case_feature = true;
            }
            TokensBuilder::safe_append
                      (in_stack_fffffffffffffd40,(CharInfo *)in_stack_fffffffffffffd38);
            if ((local_139 & 1) != 0) {
              TokensBuilder::append
                        (in_stack_fffffffffffffd40,
                         (vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>
                          *)in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30,
                         (size_t)in_stack_fffffffffffffd28);
              local_118 = local_130 - 1;
            }
            local_10c = 1;
          }
        }
        else {
          pTVar6 = TokensBuilder::current(&local_108);
          CVar3 = pTVar6->casing;
          letter_case = local_120->case_type;
          sVar5 = TokensBuilder::current_length(&local_108);
          local_170 = update_casing(CVar3,letter_case,sVar5);
          local_171 = 0;
          local_172 = false;
          local_173 = 0;
          local_26b = true;
          if ((local_10c != 1) && (local_26b = false, local_10c == 0)) {
            local_25f = false;
            if ((local_110 == local_140) && (local_25f = false, -1 < local_140)) {
              local_180._M_cur =
                   (__node_type *)
                   std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                   ::find((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)in_stack_fffffffffffffd18,(key_type *)0x3c58c6);
              local_188._M_cur =
                   (__node_type *)
                   std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                   ::end((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)in_stack_fffffffffffffd18);
              local_25f = std::__detail::operator!=(&local_180,&local_188);
            }
            local_172 = local_25f;
            local_26b = true;
            if (local_25f == false) {
              local_26a = 0;
              if (local_110 != local_140) {
                local_26a = *(byte *)(in_RDI + 0x5f);
              }
              local_173 = local_26a & 1;
              local_26b = true;
              if (((local_26a & 1) == 0) && (local_26b = true, local_110 != -2)) {
                local_26b = (*(byte *)(in_RDI + 0x5d) & 1) != 0;
                if (local_26b) {
                  local_171 = local_170 == Mixed;
                }
                local_26b = local_26b && local_170 == Mixed;
              }
            }
          }
          if (local_26b) {
            pTVar6 = TokensBuilder::current(&local_108);
            pTVar6->join_right = true;
            if (((*(byte *)(in_RDI + 0x5b) & 1) != 0) &&
               ((((local_171 & 1) != 0 || ((local_172 & 1U) != 0)) || ((local_173 & 1) != 0)))) {
              in_stack_fffffffffffffd80 = (TokensBuilder *)TokensBuilder::current(&local_108);
              *(undefined1 *)((long)&in_stack_fffffffffffffd80->_current_token + 0x1b) = 1;
            }
            TokensBuilder::segment(in_stack_fffffffffffffd60);
            in_stack_fffffffffffffd78 = TokensBuilder::current(&local_108);
            CVar3 = update_casing(in_stack_fffffffffffffd78->casing,local_120->case_type,0);
            pTVar6 = TokensBuilder::current(&local_108);
            pTVar6->casing = CVar3;
          }
          else {
            in_stack_fffffffffffffd5c = local_170;
            in_stack_fffffffffffffd60 = (TokensBuilder *)TokensBuilder::current(&local_108);
            *(Casing *)((long)&in_stack_fffffffffffffd60->_current_token + 0x14) =
                 in_stack_fffffffffffffd5c;
            if (local_10c == 3) {
              bVar2 = TokensBuilder::is_new_token((TokensBuilder *)0x3c5af8);
              in_stack_fffffffffffffd58 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd58);
              if (bVar2) {
                in_stack_fffffffffffffd50 = TokensBuilder::previous((TokensBuilder *)0x3c5b15);
                in_stack_fffffffffffffd50->join_right = true;
              }
            }
          }
          TokensBuilder::safe_append
                    (in_stack_fffffffffffffd40,(CharInfo *)in_stack_fffffffffffffd38);
          if ((local_139 & 1) != 0) {
            TokensBuilder::append
                      (in_stack_fffffffffffffd40,
                       (vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *)
                       in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30,
                       (size_t)in_stack_fffffffffffffd28);
            local_118 = local_130 - 1;
          }
          local_10c = 0;
          local_110 = local_140;
        }
      }
      else if (local_10c == 3) {
        pTVar6 = TokensBuilder::previous((TokensBuilder *)0x3c5415);
        pTVar6->join_right = true;
      }
      else if (local_10c == 2) {
        pTVar6 = TokensBuilder::current(&local_108);
        pTVar6->join_left = true;
      }
      else {
        TokensBuilder::segment(in_stack_fffffffffffffd60);
        pTVar6 = TokensBuilder::previous((TokensBuilder *)0x3c5478);
        pTVar6->join_right = true;
        local_10c = 2;
      }
    }
  }
  TokensBuilder::~TokensBuilder(in_stack_fffffffffffffd20);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
  std::vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_>::~vector
            ((vector<onmt::unicode::CharInfo,_std::allocator<onmt::unicode::CharInfo>_> *)
             in_stack_fffffffffffffd30);
  return;
}

Assistant:

void Tokenizer::tokenize_text(const std::string& text,
                                std::vector<Token>& annotated_tokens,
                                std::unordered_map<std::string, size_t>* alphabets) const
  {
    // TODO: this method has grown big and is hard to follow. It should be refactored into
    // smaller pieces to clarify its logic.

    const auto chars = unicode::get_characters_info(text);

    std::vector<int> scripts;

    {
      scripts.reserve(chars.size());
      int previous_script = -1;
      for (const auto& c : chars) {
        const int script = unicode::get_script(c.value, previous_script);
        scripts.emplace_back(script);
        if (script != -1)
          previous_script = script;
      }
    }

    TokensBuilder builder(_options, annotated_tokens);
    State state = State::Space;
    int prev_alphabet = -1;

    for (size_t i = 0; i < chars.size(); ++i)
    {
      const auto& c = chars[i];
      const unicode::code_point_t v = c.value;
      if (v < 32 || v == 0xFEFF)  // skip special characters and BOM
        continue;

      const size_t next_index = get_next_main_char(chars, scripts, i, _options);
      const auto* next_c = next_index < chars.size() ? &chars[next_index] : nullptr;
      const bool has_combining_marks = (next_index != i + 1);

      if (state == State::Placeholder)
      {
        if (v == ph_marker_close_cp)
        {
          builder.append(c);
          if (_options.preserve_placeholders)
            builder.current().preserve = true;
          prev_alphabet = placeholder_alphabet;
          state = State::Letter;
        }
        else if (c.char_type == unicode::CharType::Separator)
          builder.escape_append(c);
        else
          builder.append(c);
      }

      else if (v == ph_marker_open_cp)
      {
        if (state != State::Space)
        {
          builder.segment();
          if ((state == State::Letter && prev_alphabet != placeholder_alphabet)
              || state == State::Number)
            builder.current().join_left = true;
          else
            builder.previous().join_right = true;
        }
        builder.append(c);
        state = State::Placeholder;
      }

      else if (c.char_type == unicode::CharType::Separator)
      {
        if (has_combining_marks)
        {
          if (state != State::Space)
          {
            builder.segment();
            builder.current().join_left = true;
          }

          builder.escape_append(c);
          builder.append(chars, i + 1, next_index);
          builder.segment();
          i = next_index - 1;
          state = State::Other;
        }
        else
        {
          if (state != State::Space)
            builder.segment();

          if (_options.with_separators)
          {
            builder.append(c);
            if (!next_c || next_c->char_type != unicode::CharType::Separator)
              builder.segment();
          }

          state = State::Space;
        }
      }

      else if (_options.support_prior_joiners && c == _options.joiner)
      {
        if (state == State::Other)
          builder.previous().join_right = true;
        else if (state == State::Space)
          builder.current().join_left = true;
        else
        {
          builder.segment();
          builder.previous().join_right = true;
          state = State::Space;
        }
      }

      else
      {
        bool is_letter = c.char_type == unicode::CharType::Letter;
        bool is_number = c.char_type == unicode::CharType::Number;

        int alphabet = -1;
        if (is_number)
          alphabet = number_alphabet;
        else if (is_letter)
          alphabet = scripts[i];

        if (alphabets != nullptr)
        {
          const char* alphabet_name = "Other";
          if (is_number)
            alphabet_name = "Numeric";
          else if (is_letter && alphabet >= 0)
            alphabet_name = unicode::get_script_name(alphabet);
          (*alphabets)[alphabet_name]++;
        }

        if (_options.mode == Mode::Conservative)
        {
          if (is_number
              || (c == '_')
              || (state == State::Letter && c == '-')
              || (state == State::Letter
                  && (c == '.' || c == ',')
                  && next_c
                  && (next_c->char_type == unicode::CharType::Number
                      || next_c->char_type == unicode::CharType::Letter)))
          {
            is_letter = true;
            alphabet = number_alphabet;
          }
        }

        if (is_letter && _options.mode != Mode::Char)
        {
          const Casing new_casing = update_casing(builder.current().casing,
                                                  c.case_type,
                                                  builder.current_length());

          bool segment_case = false;
          bool segment_alphabet = false;
          bool segment_alphabet_change = false;
          if (state == State::Number
              || (state == State::Letter &&
                  ((segment_alphabet = (prev_alphabet == alphabet
                                        && alphabet >= 0
                                        && (_options.segment_alphabet_codes.find(alphabet)
                                            != _options.segment_alphabet_codes.end())))
                   || (segment_alphabet_change = (prev_alphabet != alphabet
                                                  && _options.segment_alphabet_change))
                   || (prev_alphabet == placeholder_alphabet)
                   || (_options.segment_case
                       && (segment_case = (new_casing == Casing::Mixed))))))
          {
            builder.current().join_right = true;
            if (_options.preserve_segmented_tokens
                && (segment_case || segment_alphabet || segment_alphabet_change))
              builder.current().preserve = true;
            builder.segment();
            builder.current().casing = update_casing(builder.current().casing, c.case_type, 0);
          }
          else
          {
            builder.current().casing = new_casing;
            if (state == State::Other && builder.is_new_token())
              builder.previous().join_right = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          state = State::Letter;
          prev_alphabet = alphabet;
        }
        else if (is_number && _options.mode != Mode::Char)
        {
          const bool segment_number = (_options.segment_numbers && state == State::Number);
          if (state == State::Letter || segment_number)
          {
            if (_options.preserve_segmented_tokens && segment_number)
              builder.current().preserve = true;
            builder.segment();
            if (state != State::Letter || prev_alphabet == placeholder_alphabet)
              builder.previous().join_right = true;
            else
              builder.current().join_left = true;
          }
          else if (state == State::Other)
          {
            builder.previous().join_right = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          state = State::Number;
        }
        else
        {
          if (state != State::Space)
          {
            builder.segment();
            builder.current().join_left = true;
            if (_options.preserve_segmented_tokens && c.char_type == unicode::CharType::Mark)
              builder.current().preserve = true;
          }

          builder.safe_append(c);
          if (has_combining_marks)
          {
            builder.append(chars, i + 1, next_index);
            i = next_index - 1;
          }
          builder.segment();
          state = State::Other;
        }
      }
    }
  }